

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void __thiscall CFG::addEdge(CFG *this,CfgNode *from,CfgNode *to)

{
  bool local_31;
  bool local_21;
  CfgNode *to_local;
  CfgNode *from_local;
  CFG *this_local;
  
  local_21 = false;
  if (from != (CfgNode *)0x0) {
    local_21 = containsNode(this,from);
  }
  if (local_21 == false) {
    __assert_fail("from != 0 && this->containsNode(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                  ,0x87,"void CFG::addEdge(CfgNode *, CfgNode *)");
  }
  local_31 = false;
  if (to != (CfgNode *)0x0) {
    local_31 = containsNode(this,to);
  }
  if (local_31 == false) {
    __assert_fail("to != 0 && this->containsNode(to)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                  ,0x88,"void CFG::addEdge(CfgNode *, CfgNode *)");
  }
  CfgNode::addSuccessor(from,to);
  CfgNode::addPredecessor(to,from);
  this->m_status = UNCHECKED;
  return;
}

Assistant:

void CFG::addEdge(CfgNode* from, CfgNode* to) {
	assert(from != 0 && this->containsNode(from));
	assert(to != 0 && this->containsNode(to));

	from->addSuccessor(to);
	to->addPredecessor(from);

	m_status = CFG::UNCHECKED;
}